

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_compress.c
# Opt level: O0

ZSTD_parameters *
ZSTD_getParams(ZSTD_parameters *__return_storage_ptr__,int compressionLevel,
              unsigned_long_long srcSizeHint,size_t dictSize)

{
  ZSTD_parameters *params;
  undefined1 local_3c [8];
  ZSTD_compressionParameters cParams;
  size_t dictSize_local;
  unsigned_long_long srcSizeHint_local;
  int compressionLevel_local;
  
  cParams._20_8_ = dictSize;
  ZSTD_getCParams((ZSTD_compressionParameters *)local_3c,compressionLevel,srcSizeHint,dictSize);
  memset(__return_storage_ptr__,0,0x28);
  (__return_storage_ptr__->cParams).windowLog = local_3c._0_4_;
  (__return_storage_ptr__->cParams).chainLog = local_3c._4_4_;
  (__return_storage_ptr__->cParams).hashLog = cParams.windowLog;
  (__return_storage_ptr__->cParams).searchLog = cParams.chainLog;
  (__return_storage_ptr__->cParams).minMatch = cParams.hashLog;
  (__return_storage_ptr__->cParams).targetLength = cParams.searchLog;
  (__return_storage_ptr__->cParams).strategy = cParams.minMatch;
  (__return_storage_ptr__->fParams).contentSizeFlag = 1;
  return __return_storage_ptr__;
}

Assistant:

ZSTD_parameters ZSTD_getParams(int compressionLevel, unsigned long long srcSizeHint, size_t dictSize) {
    ZSTD_parameters params;
    ZSTD_compressionParameters const cParams = ZSTD_getCParams(compressionLevel, srcSizeHint, dictSize);
    DEBUGLOG(5, "ZSTD_getParams (cLevel=%i)", compressionLevel);
    memset(&params, 0, sizeof(params));
    params.cParams = cParams;
    params.fParams.contentSizeFlag = 1;
    return params;
}